

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * __thiscall
CLI::Formatter::make_positionals_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *app)

{
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> opts;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_a8;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_90;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  string local_58;
  string local_38;
  
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<bool_(const_CLI::Option_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/app/CLI11.hpp:11168:26)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<bool_(const_CLI::Option_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/app/CLI11.hpp:11168:26)>
             ::_M_manager;
  App::get_options(&local_a8,app,(function<bool_(const_CLI::Option_*)> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (local_a8.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>._M_impl
      .super__Vector_impl_data._M_start ==
      local_a8.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"positionals","");
    FormatterBase::get_label(&local_38,&this->super_FormatterBase,&local_58);
    std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::vector
              (&local_90,&local_a8);
    (*(this->super_FormatterBase)._vptr_FormatterBase[3])
              (__return_storage_ptr__,this,&local_38,1,&local_90);
    if (local_90.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.
                      super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
  }
  if (local_a8.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.
                    super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string Formatter::make_positionals(const App *app) const {
    std::vector<const Option *> opts =
        app->get_options([](const Option *opt) { return !opt->get_group().empty() && opt->get_positional(); });

    if(opts.empty())
        return {};

    return make_group(get_label("positionals"), true, opts);
}